

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

void tinyexr::sendCode(longlong sCode,int runCount,longlong runCode,longlong *c,int *lc,char **out)

{
  int *lc_00;
  longlong lVar1;
  longlong *c_00;
  longlong *in_RCX;
  longlong in_RDX;
  int in_ESI;
  longlong in_RDI;
  int *in_R8;
  char **in_R9;
  char **in_stack_ffffffffffffffb8;
  int local_c;
  
  lc_00 = (int *)hufLength(in_RDI);
  lVar1 = hufLength(in_RDX);
  c_00 = (longlong *)((long)lc_00 + lVar1 + 8);
  lVar1 = hufLength(in_RDI);
  local_c = in_ESI;
  if ((long)c_00 < lVar1 * in_ESI) {
    outputCode((longlong)in_R9,c_00,lc_00,in_stack_ffffffffffffffb8);
    outputCode((longlong)in_R9,c_00,lc_00,in_stack_ffffffffffffffb8);
    outputBits(8,(long)in_ESI,in_RCX,in_R8,in_R9);
  }
  else {
    while (-1 < local_c) {
      outputCode((longlong)in_R9,c_00,lc_00,in_stack_ffffffffffffffb8);
      local_c = local_c + -1;
    }
  }
  return;
}

Assistant:

inline void sendCode(long long sCode, int runCount, long long runCode,
                     long long &c, int &lc, char *&out) {
  //
  // Output a run of runCount instances of the symbol sCount.
  // Output the symbols explicitly, or if that is shorter, output
  // the sCode symbol once followed by a runCode symbol and runCount
  // expressed as an 8-bit number.
  //

  if (hufLength(sCode) + hufLength(runCode) + 8 < hufLength(sCode) * runCount) {
    outputCode(sCode, c, lc, out);
    outputCode(runCode, c, lc, out);
    outputBits(8, runCount, c, lc, out);
  } else {
    while (runCount-- >= 0) outputCode(sCode, c, lc, out);
  }
}